

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

void __thiscall
PDFDocumentHandler::RegisterResourcesForResourcesCategory
          (PDFDocumentHandler *this,PDFFormXObject *inTargetFormXObject,
          ICategoryServicesCommand *inCommand,PDFDictionary *inResourcesDictionary,
          ObjectIDTypeList *ioObjectsToLaterCopy,StringToStringMap *ioMappedResourcesNames)

{
  PDFParser *this_00;
  DocumentContext *this_01;
  iterator this_02;
  bool bVar1;
  EPDFObjectType EVar2;
  PDFObject *inPDFObject;
  PDFDictionary *pPVar3;
  mapped_type pPVar4;
  IndirectObjectsReferenceRegistry *this_03;
  pointer ppVar5;
  key_type pPVar6;
  string *psVar7;
  ResourceCopierTask *this_04;
  pointer ppVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_bool> pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  string local_220;
  string local_200;
  string local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  _Base_ptr local_180;
  undefined1 local_178;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  iterator itInsert;
  ResourceCopierTask *task;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  _Base_ptr local_d0;
  undefined1 local_c8;
  pair<const_unsigned_long,_unsigned_long> local_c0;
  _Self local_b0;
  ObjectIDType local_a8;
  ObjectIDType targetObjectID;
  iterator itObjects;
  PDFIndirectObjectReference *indirectReference;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  it;
  string local_68;
  undefined1 local_48 [8];
  PDFObjectCastPtr<PDFDictionary> resourcesCategoryDictionary;
  StringToStringMap *ioMappedResourcesNames_local;
  ObjectIDTypeList *ioObjectsToLaterCopy_local;
  PDFDictionary *inResourcesDictionary_local;
  ICategoryServicesCommand *inCommand_local;
  PDFFormXObject *inTargetFormXObject_local;
  PDFDocumentHandler *this_local;
  
  this_00 = this->mParser;
  resourcesCategoryDictionary.super_RefCountPtr<PDFDictionary>.mValue =
       (PDFDictionary *)ioMappedResourcesNames;
  (*inCommand->_vptr_ICategoryServicesCommand[2])();
  inPDFObject = PDFParser::QueryDictionaryObject(this_00,inResourcesDictionary,&local_68);
  PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)local_48,inPDFObject);
  std::__cxx11::string::~string((string *)&local_68);
  pPVar3 = RefCountPtr<PDFDictionary>::GetPtr((RefCountPtr<PDFDictionary> *)local_48);
  if (pPVar3 != (PDFDictionary *)0x0) {
    pPVar3 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)local_48);
    PDFDictionary::GetIterator
              ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                *)&indirectReference,pPVar3);
    while (bVar1 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   ::MoveNext((ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                               *)&indirectReference), bVar1) {
      pPVar4 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                           *)&indirectReference);
      EVar2 = PDFObject::GetType(pPVar4);
      if (EVar2 == ePDFObjectIndirectObjectReference) {
        itObjects._M_node =
             (_Base_ptr)
             MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                         *)&indirectReference);
        targetObjectID =
             (ObjectIDType)
             std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::find(&this->mSourceToTarget,(key_type *)((long)itObjects._M_node + 0x48));
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::end(&this->mSourceToTarget);
        bVar1 = std::operator==((_Self *)&targetObjectID,&local_b0);
        if (bVar1) {
          this_03 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
          local_a8 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_03);
          std::pair<const_unsigned_long,_unsigned_long>::
          pair<unsigned_long_&,_unsigned_long_&,_true>
                    (&local_c0,(unsigned_long *)&itObjects._M_node[2]._M_parent,&local_a8);
          pVar9 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::insert(&this->mSourceToTarget,&local_c0);
          local_d0 = (_Base_ptr)pVar9.first._M_node;
          local_c8 = pVar9.second;
          std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (ioObjectsToLaterCopy,(value_type_conflict *)&itObjects._M_node[2]._M_parent);
        }
        else {
          ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                              &targetObjectID);
          local_a8 = ppVar5->second;
        }
        pPVar3 = resourcesCategoryDictionary.super_RefCountPtr<PDFDictionary>.mValue;
        pPVar6 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                           *)&indirectReference);
        psVar7 = PDFName::GetValue_abi_cxx11_(pPVar6);
        AsEncodedName(&local_130,this,psVar7);
        (*inCommand->_vptr_ICategoryServicesCommand[3])(&local_150,inCommand,local_a8);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_110,&local_130,&local_150);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)pPVar3,&local_110);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_110);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_130);
      }
      else {
        this_04 = (ResourceCopierTask *)operator_new(0x40);
        pPVar4 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 ::GetValue((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                             *)&indirectReference);
        ResourceCopierTask::ResourceCopierTask(this_04,inTargetFormXObject,this,pPVar4);
        pPVar3 = resourcesCategoryDictionary.super_RefCountPtr<PDFDictionary>.mValue;
        itInsert._M_node = (_Base_ptr)this_04;
        pPVar6 = MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 ::GetKey((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                           *)&indirectReference);
        psVar7 = PDFName::GetValue_abi_cxx11_(pPVar6);
        AsEncodedName(&local_1e0,this,psVar7);
        this_01 = this->mDocumentContext;
        (*inCommand->_vptr_ICategoryServicesCommand[2])(&local_220);
        PDFHummus::DocumentContext::AddExtendedResourceMapping
                  (&local_200,this_01,inTargetFormXObject,&local_220,
                   (IResourceWritingTask *)itInsert._M_node);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_1c0,&local_1e0,&local_200);
        pVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pPVar3,&local_1c0);
        local_180 = (_Base_ptr)pVar10.first._M_node;
        local_178 = pVar10.second;
        local_170._M_node = local_180;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_1c0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_1e0);
        this_02 = itInsert;
        ppVar8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_170);
        ResourceCopierTask::SetResourceName((ResourceCopierTask *)this_02._M_node,&ppVar8->second);
      }
    }
  }
  PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFDictionary> *)local_48);
  return;
}

Assistant:

void PDFDocumentHandler::RegisterResourcesForResourcesCategory(PDFFormXObject* inTargetFormXObject,
                                                               ICategoryServicesCommand* inCommand,
                                                               PDFDictionary* inResourcesDictionary,
                                                               ObjectIDTypeList& ioObjectsToLaterCopy,
                                                               StringToStringMap& ioMappedResourcesNames)
{
    PDFObjectCastPtr<PDFDictionary> resourcesCategoryDictionary(mParser->QueryDictionaryObject(
                                                                                    inResourcesDictionary,inCommand->GetResourcesCategoryName()));
    if(resourcesCategoryDictionary.GetPtr())
    {	
        MapIterator<PDFNameToPDFObjectMap> it(resourcesCategoryDictionary->GetIterator());
        while(it.MoveNext())
        {
            if(it.GetValue()->GetType() == PDFObject::ePDFObjectIndirectObjectReference)
            {
                PDFIndirectObjectReference* indirectReference = (PDFIndirectObjectReference*)(it.GetValue());
                ObjectIDTypeToObjectIDTypeMap::iterator	itObjects = mSourceToTarget.find(indirectReference->mObjectID);
                ObjectIDType targetObjectID;
                if(itObjects == mSourceToTarget.end())
                {
                    targetObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
                    mSourceToTarget.insert(ObjectIDTypeToObjectIDTypeMap::value_type(indirectReference->mObjectID,targetObjectID));
                    ioObjectsToLaterCopy.push_back(indirectReference->mObjectID);
                }
                else
                {
                    targetObjectID = itObjects->second;
                }
                ioMappedResourcesNames.insert(StringToStringMap::value_type(AsEncodedName(it.GetKey()->GetValue()),
                                                                            inCommand->RegisterInDirectResourceInFormResources(targetObjectID)));
            }
            else 
            {
                
                ResourceCopierTask* task = new ResourceCopierTask(inTargetFormXObject,this,it.GetValue());
                StringToStringMap::iterator itInsert = ioMappedResourcesNames.insert(StringToStringMap::value_type(AsEncodedName(it.GetKey()->GetValue()),
                                                                            mDocumentContext->AddExtendedResourceMapping(inTargetFormXObject, inCommand->GetResourcesCategoryName(),
                                                                                task))).first;
                task->SetResourceName(itInsert->second);
            }
        }
    }
}